

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O2

vector<Reading,_std::allocator<Reading>_> *
get_readings_from_file
          (vector<Reading,_std::allocator<Reading>_> *__return_storage_ptr__,string *file_name)

{
  runtime_error *this;
  Reading r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ifstream ifs;
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&ifs,(string *)file_name,_S_in);
  if ((abStack_210[*(long *)(_ifs + -0x18)] & 5) == 0) {
    (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      operator>>((istream *)&ifs,&r);
      if ((abStack_210[*(long *)(_ifs + -0x18)] & 7) != 0) break;
      if (r.temp_unit == 'f') {
        r.temp = (r.temp + -32.0) / 1.8;
      }
      std::vector<Reading,_std::allocator<Reading>_>::push_back(__return_storage_ptr__,&r);
      r.temp = 4294967295.0;
      r.hour = 0x19;
      r.temp_unit = 'k';
    }
    std::ifstream::~ifstream(&ifs);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,"\'",file_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,&local_250,
                 "\' could not be opened for reading.");
  std::runtime_error::runtime_error(this,(string *)&r);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<Reading> get_readings_from_file(const std::string& file_name)
{
	static const auto invalid_temp{ UINT32_MAX };
	static const auto invalid_hour{ 25 };
	static const auto invalid_temp_unit{ 'k' };
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		throw std::runtime_error("'" + file_name + "' could not be opened for reading.");
	}
	std::vector<Reading> readings;
	Reading r;
	while (ifs >> r && !ifs.eof())
	{
		if (r.temp_unit == 'f')
		{
			r.temp = fahr_to_celc(r.temp);
		}
		readings.push_back(r);
		r.temp = invalid_temp;
		r.hour = invalid_hour;
		r.temp_unit = invalid_temp_unit;
	}
	return readings;
}